

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::lookingAtLeadingWhitespace(SelectionCompiler *this)

{
  int iVar1;
  int iVar2;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar1 = this->ichToken;
  lVar6 = (long)iVar1;
  iVar2 = this->cchScript;
  pcVar3 = (this->script)._M_dataplus._M_p;
  iVar5 = iVar2;
  if (iVar2 < iVar1) {
    iVar5 = iVar1;
  }
  do {
    if (iVar2 <= lVar6) {
LAB_001f71e2:
      this->cchToken = iVar5 - iVar1;
      return iVar5 - iVar1 != 0 && iVar1 <= iVar5;
    }
    iVar4 = isspace((int)pcVar3[lVar6]);
    if (iVar4 == 0) {
      iVar5 = (int)lVar6;
      goto LAB_001f71e2;
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

bool SelectionCompiler::lookingAtLeadingWhitespace() {
    int ichT = ichToken;
    while (ichT < cchScript && std::isspace(script[ichT])) {
      ++ichT;
    }
    cchToken = ichT - ichToken;
    return cchToken > 0;
  }